

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4f7cf6::BuildEngineImpl::finishScanRequest
          (BuildEngineImpl *this,RuleInfo *inputRuleInfo,StateKind newState)

{
  RuleScanRecord *pRVar1;
  pointer pRVar2;
  pointer pTVar3;
  _Map_pointer ppTVar4;
  TaskInfo *pTVar5;
  uintptr_t uVar6;
  RuleInfo *pRVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined5 uVar11;
  int iVar12;
  TaskInputRequest *pTVar13;
  _Elt_pointer pTVar14;
  pointer pTVar15;
  size_type __nodes_to_add;
  RuleScanRequest *request;
  pointer pRVar16;
  RuleScanRecord *local_38;
  
  if (inputRuleInfo->state != IsScanning) {
    __assert_fail("inputRuleInfo.isScanning()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x2b3,
                  "void (anonymous namespace)::BuildEngineImpl::finishScanRequest(RuleInfo &, RuleInfo::StateKind)"
                 );
  }
  pRVar1 = (inputRuleInfo->inProgressInfo).pendingScanRecord;
  pRVar16 = (pRVar1->deferredScanRequests).
            super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (pRVar1->deferredScanRequests).
           super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar16 != pRVar2) {
    do {
      std::
      vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
      ::push_back(&this->ruleInfosToScan,pRVar16);
      pRVar16 = pRVar16 + 1;
    } while (pRVar16 != pRVar2);
  }
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->inputRequestsMutex);
  if (iVar12 == 0) {
    pTVar15 = (pRVar1->pausedInputRequests).
              super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (pRVar1->pausedInputRequests).
             super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar15 != pTVar3) {
      pTVar14 = (this->inputRequests).
                super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      do {
        if (pTVar14 ==
            (this->inputRequests).
            super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          ppTVar4 = (this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          __nodes_to_add =
               ((((ulong)((long)ppTVar4 -
                         (long)(this->inputRequests).
                               super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppTVar4 == (_Map_pointer)0x0)) * 0x10;
          if (((long)(this->inputRequests).
                     super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last -
               (long)(this->inputRequests).
                     super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
              ((long)pTVar14 -
               (long)(this->inputRequests).
                     super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) + __nodes_to_add ==
              0x3ffffffffffffff) {
            std::__throw_length_error("cannot create std::deque larger than max_size()");
          }
          std::
          deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ::_M_reserve_map_at_back(&this->inputRequests,__nodes_to_add);
          pTVar13 = (TaskInputRequest *)operator_new(0x200);
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node[1] = pTVar13;
          pTVar14 = (this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          uVar6 = pTVar15->inputID;
          pRVar7 = pTVar15->inputRuleInfo;
          bVar8 = pTVar15->orderOnly;
          bVar9 = pTVar15->forcePriorValue;
          bVar10 = pTVar15->singleUse;
          uVar11 = *(undefined5 *)&pTVar15->field_0x1b;
          pTVar14->taskInfo = pTVar15->taskInfo;
          pTVar14->inputID = uVar6;
          pTVar14->inputRuleInfo = pRVar7;
          pTVar14->orderOnly = bVar8;
          pTVar14->forcePriorValue = bVar9;
          pTVar14->singleUse = bVar10;
          *(undefined5 *)&pTVar14->field_0x1b = uVar11;
          ppTVar4 = (this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node;
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_node = ppTVar4 + 1;
          pTVar14 = ppTVar4[1];
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first = pTVar14;
          (this->inputRequests).
          super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_last = pTVar14 + 0x10;
        }
        else {
          pTVar5 = pTVar15->taskInfo;
          uVar6 = pTVar15->inputID;
          bVar8 = pTVar15->orderOnly;
          bVar9 = pTVar15->forcePriorValue;
          bVar10 = pTVar15->singleUse;
          uVar11 = *(undefined5 *)&pTVar15->field_0x1b;
          pTVar14->inputRuleInfo = pTVar15->inputRuleInfo;
          pTVar14->orderOnly = bVar8;
          pTVar14->forcePriorValue = bVar9;
          pTVar14->singleUse = bVar10;
          *(undefined5 *)&pTVar14->field_0x1b = uVar11;
          pTVar14->taskInfo = pTVar5;
          pTVar14->inputID = uVar6;
          pTVar14 = (this->inputRequests).
                    super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        (this->inputRequests).
        super__Deque_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = pTVar14;
        pTVar15 = pTVar15 + 1;
      } while (pTVar15 != pTVar3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->inputRequestsMutex);
    if ((ulong)((long)(this->freeRuleScanRecords).
                      super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->freeRuleScanRecords).
                      super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <
        this->maximumFreeRuleScanRecords) {
      pTVar15 = (pRVar1->pausedInputRequests).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pRVar1->pausedInputRequests).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish != pTVar15) {
        (pRVar1->pausedInputRequests).
        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar15;
      }
      pRVar16 = (pRVar1->deferredScanRequests).
                super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((pRVar1->deferredScanRequests).
          super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
          ._M_impl.super__Vector_impl_data._M_finish != pRVar16) {
        (pRVar1->deferredScanRequests).
        super__Vector_base<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRequest>_>
        ._M_impl.super__Vector_impl_data._M_finish = pRVar16;
      }
      local_38 = pRVar1;
      std::
      vector<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*,_std::allocator<(anonymous_namespace)::BuildEngineImpl::RuleScanRecord_*>_>
      ::push_back(&this->freeRuleScanRecords,&local_38);
    }
    (inputRuleInfo->inProgressInfo).pendingScanRecord = (RuleScanRecord *)0x0;
    inputRuleInfo->state = newState;
    return;
  }
  std::__throw_system_error(iVar12);
}

Assistant:

bool isScanning() const {
      return state == StateKind::IsScanning;
    }